

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O1

void dataOfferHandleOffer(void *userData,wl_data_offer *offer,char *mimeType)

{
  uint uVar1;
  int iVar2;
  GLFWbool *pGVar3;
  
  if (_glfw.wl.offerCount != 0) {
    pGVar3 = &(_glfw.wl.offers)->text_uri_list;
    uVar1 = _glfw.wl.offerCount;
    do {
      if (((_GLFWofferWayland *)(pGVar3 + -3))->offer == offer) {
        iVar2 = strcmp(mimeType,"text/plain;charset=utf-8");
        if (iVar2 == 0) {
          pGVar3[-1] = 1;
          return;
        }
        iVar2 = strcmp(mimeType,"text/uri-list");
        if (iVar2 != 0) {
          return;
        }
        *pGVar3 = 1;
        return;
      }
      pGVar3 = pGVar3 + 4;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

static void dataOfferHandleOffer(void* userData,
                                 struct wl_data_offer* offer,
                                 const char* mimeType)
{
    for (unsigned int i = 0; i < _glfw.wl.offerCount; i++)
    {
        if (_glfw.wl.offers[i].offer == offer)
        {
            if (strcmp(mimeType, "text/plain;charset=utf-8") == 0)
                _glfw.wl.offers[i].text_plain_utf8 = GLFW_TRUE;
            else if (strcmp(mimeType, "text/uri-list") == 0)
                _glfw.wl.offers[i].text_uri_list = GLFW_TRUE;

            break;
        }
    }
}